

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_request.cpp
# Opt level: O2

int __thiscall cppcms::http::request::on_content_progress(request *this,size_t n)

{
  pointer pcVar1;
  basic_content_filter *pbVar2;
  multipart_parser *this_00;
  bool bVar3;
  parsing_result_type pVar4;
  int iVar5;
  longlong size;
  file *pfVar6;
  long lVar7;
  request *this_01;
  istream *piVar8;
  _data *p_Var9;
  long lVar10;
  char *buffer_end;
  __shared_ptr<cppcms::http::file,_(__gnu_cxx::_Lock_policy)2> *p_Var11;
  char *begin;
  file_ptr f;
  string res;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a8;
  files_type mp;
  string local_50;
  
  if (n == 0) {
    iVar5 = 0;
  }
  else {
    p_Var9 = (this->d).ptr_;
    pcVar1 = (p_Var9->post_data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    p_Var9->read_size = p_Var9->read_size + n;
    begin = pcVar1;
    if (p_Var9->filter_is_raw_content_filter == true) {
      (*p_Var9->filter->_vptr_basic_content_filter[4])(p_Var9->filter,pcVar1,n);
      p_Var9 = (this->d).ptr_;
    }
    if ((p_Var9->multipart_parser).ptr_ != (multipart_parser *)0x0) {
      size = content_limits::content_length_limit(&p_Var9->limits);
      buffer_end = pcVar1 + n;
      pVar4 = continue_input;
      do {
        p_Var9 = (this->d).ptr_;
        if (begin == buffer_end) {
          lVar7 = p_Var9->content_length;
          lVar10 = p_Var9->read_size;
          if (pVar4 != eof && lVar10 == lVar7) {
            return 400;
          }
          goto LAB_0020033c;
        }
        pVar4 = cppcms::impl::multipart_parser::consume
                          ((p_Var9->multipart_parser).ptr_,&begin,buffer_end);
        iVar5 = 400;
        switch(pVar4) {
        case meta_ready:
          p_Var9 = (this->d).ptr_;
          if (p_Var9->filter_is_multipart_filter == true) {
            pfVar6 = cppcms::impl::multipart_parser::get_file((p_Var9->multipart_parser).ptr_);
            pbVar2 = ((this->d).ptr_)->filter;
            (*pbVar2->_vptr_basic_content_filter[4])(pbVar2,pfVar6);
          }
          break;
        case content_partial:
          pfVar6 = cppcms::impl::multipart_parser::get_file
                             ((((this->d).ptr_)->multipart_parser).ptr_);
          bVar3 = size_ok(this,pfVar6,size);
          if (!bVar3) {
            return 0x19d;
          }
          p_Var9 = (this->d).ptr_;
          if (p_Var9->filter_is_multipart_filter == true) {
            pbVar2 = p_Var9->filter;
            (*pbVar2->_vptr_basic_content_filter[5])(pbVar2,pfVar6);
          }
          break;
        case content_ready:
          pfVar6 = cppcms::impl::multipart_parser::last_file
                             ((((this->d).ptr_)->multipart_parser).ptr_);
          piVar8 = file::data(pfVar6);
          std::istream::seekg(piVar8,0,0);
          bVar3 = size_ok(this,pfVar6,size);
          if (!bVar3) {
            return 0x19d;
          }
          p_Var9 = (this->d).ptr_;
          if (p_Var9->filter_is_multipart_filter == true) {
            pbVar2 = p_Var9->filter;
            (*pbVar2->_vptr_basic_content_filter[6])(pbVar2,pfVar6);
          }
          break;
        case continue_input:
          break;
        case eof:
          if (begin != buffer_end) {
            return 400;
          }
          p_Var9 = (this->d).ptr_;
          if (p_Var9->read_size != p_Var9->content_length) {
            return 400;
          }
          break;
        case no_room_left:
          return 0x19d;
        default:
          goto switchD_002001fb_default;
        }
      } while( true );
    }
    lVar7 = p_Var9->content_length;
    lVar10 = p_Var9->read_size;
LAB_0020033c:
    iVar5 = 0;
    if (lVar10 == lVar7) {
      if (p_Var9->read_full == true) {
        this_01 = (request *)lazy_content_type(this);
        bVar3 = http::content_type::is_form_urlencoded((content_type *)this_01);
        if (bVar3) {
          p_Var9 = (this->d).ptr_;
          parse_form_urlencoded
                    (this_01,(p_Var9->post_data).super__Vector_base<char,_std::allocator<char>_>.
                             _M_impl.super__Vector_impl_data._M_start,
                     (p_Var9->post_data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_finish,&this->post_);
        }
      }
      else {
        local_a8.first._M_dataplus._M_p =
             (p_Var9->post_data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
        local_a8.first._M_string_length =
             (size_type)
             (p_Var9->post_data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish;
        local_a8.first.field_2._M_allocated_capacity =
             (size_type)
             (p_Var9->post_data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
        (p_Var9->post_data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (p_Var9->post_data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (p_Var9->post_data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                  ((_Vector_base<char,_std::allocator<char>_> *)&local_a8);
      }
      p_Var9 = (this->d).ptr_;
      if (p_Var9->filter != (basic_content_filter *)0x0) {
        (*p_Var9->filter->_vptr_basic_content_filter[2])();
        p_Var9 = (this->d).ptr_;
      }
      this_00 = (p_Var9->multipart_parser).ptr_;
      if (this_00 != (multipart_parser *)0x0) {
        cppcms::impl::multipart_parser::get_files(&mp,this_00);
        booster::hold_ptr<cppcms::impl::multipart_parser>::reset
                  (&((this->d).ptr_)->multipart_parser,(multipart_parser *)0x0);
        for (p_Var11 = &(mp.
                         super__Vector_base<std::shared_ptr<cppcms::http::file>,_std::allocator<std::shared_ptr<cppcms::http::file>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                        super___shared_ptr<cppcms::http::file,_(__gnu_cxx::_Lock_policy)2>;
            p_Var11 !=
            &(mp.
              super__Vector_base<std::shared_ptr<cppcms::http::file>,_std::allocator<std::shared_ptr<cppcms::http::file>_>_>
              ._M_impl.super__Vector_impl_data._M_finish)->
             super___shared_ptr<cppcms::http::file,_(__gnu_cxx::_Lock_policy)2>;
            p_Var11 = p_Var11 + 1) {
          std::__shared_ptr<cppcms::http::file,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (&f.super___shared_ptr<cppcms::http::file,_(__gnu_cxx::_Lock_policy)2>,p_Var11);
          bVar3 = file::has_mime(f.
                                 super___shared_ptr<cppcms::http::file,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr);
          if (bVar3) {
            std::
            vector<std::shared_ptr<cppcms::http::file>,_std::allocator<std::shared_ptr<cppcms::http::file>_>_>
            ::push_back(&this->files_,
                        (value_type *)
                        &f.super___shared_ptr<cppcms::http::file,_(__gnu_cxx::_Lock_policy)2>);
          }
          else {
            file::name_abi_cxx11_
                      (&local_50,
                       f.super___shared_ptr<cppcms::http::file,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
            file::size(f.super___shared_ptr<cppcms::http::file,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
            piVar8 = file::data(f.super___shared_ptr<cppcms::http::file,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr);
            res._M_dataplus._M_p = (pointer)&res.field_2;
            res._M_string_length = 0;
            res.field_2._M_local_buf[0] = '\0';
            std::__cxx11::string::reserve((ulong)&res);
            std::istream::seekg(piVar8,0,0);
            while (iVar5 = std::streambuf::sbumpc(), iVar5 != -1) {
              std::__cxx11::string::push_back((char)&res);
            }
            std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                      (&local_a8,&local_50,&res);
            std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
            ::_M_emplace_equal<std::pair<std::__cxx11::string,std::__cxx11::string>>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                        *)&this->post_,&local_a8);
            std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~pair(&local_a8);
            std::__cxx11::string::~string((string *)&res);
            std::__cxx11::string::~string((string *)&local_50);
          }
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&f.super___shared_ptr<cppcms::http::file,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
        }
        std::
        vector<std::shared_ptr<cppcms::http::file>,_std::allocator<std::shared_ptr<cppcms::http::file>_>_>
        ::~vector(&mp);
        p_Var9 = (this->d).ptr_;
      }
      iVar5 = 0;
      p_Var9->ready = true;
    }
  }
switchD_002001fb_default:
  return iVar5;
}

Assistant:

int request::on_content_progress(size_t n)
{
	if(n==0)
		return 0;
	char const *begin = &d->post_data[0];
	char const *end = begin + n;
	d->read_size += n;
	try {
		if(d->filter_is_raw_content_filter) {
			static_cast<raw_content_filter *>(d->filter)->on_data_chunk(&d->post_data[0],n);
		}

		if(d->multipart_parser.get()) {
			multipart_parser::parsing_result_type r = multipart_parser::continue_input;

			long long allowed=d->limits.content_length_limit();

			while(begin!=end) {
				r = d->multipart_parser->consume(begin,end);
				
				switch(r) { 
				case multipart_parser::meta_ready: 	
					{
						if(d->filter_is_multipart_filter) { 
							file &f=d->multipart_parser->get_file();
							static_cast<multipart_filter *>(d->filter)->on_new_file(f); 
						}
					}
					break;
				case multipart_parser::content_partial:
					{
						file &f=d->multipart_parser->get_file();
						if(!size_ok(f,allowed))
							return 413;
						if(d->filter_is_multipart_filter)
							 static_cast<multipart_filter *>(d->filter)->on_upload_progress(f);
					}
					break;
				case multipart_parser::content_ready:	
					{
						file &f=d->multipart_parser->last_file();
						f.data().seekg(0);
						if(!size_ok(f,allowed))
							return 413;
						if(d->filter_is_multipart_filter)
							 static_cast<multipart_filter *>(d->filter)->on_data_ready(f);
					}
					break;
				case multipart_parser::continue_input:
					break;
				case multipart_parser::no_room_left:
					return 413;
				case multipart_parser::eof:
					if(begin!=end) 
						return 400;
					if(d->read_size != d->content_length) 
						return 400;
					break;
				case multipart_parser::parsing_error:
				default:
					return 400;
				}
			}
			if(begin==end && d->read_size==d->content_length && r!=multipart_parser::eof) {
				return 400;
			}
		}

		if(d->read_size == d->content_length) {
			if(d->read_full) {
				if(lazy_content_type().is_form_urlencoded()) {
					char const *data = &d->post_data[0];
					char const *data_end = data + d->post_data.size();
					parse_form_urlencoded(data,data_end,post_);
				}
			}
			else {
				std::vector<char> tmp;
				tmp.swap(d->post_data);
			}
			if(d->filter)
				d->filter->on_end_of_content();
			if(d->multipart_parser.get()) {
				multipart_parser::files_type mp=d->multipart_parser->get_files();
				d->multipart_parser.reset();
				
				for(multipart_parser::files_type::iterator p=mp.begin();p!=mp.end();++p) {
					multipart_parser::file_ptr f=*p;
					if(!f->has_mime()) 
						post_.insert(std::make_pair(f->name(),read_file(f->size(),f->data())));
					else 
						files_.push_back(f);
				}
			}
			d->ready = true;
		}
	}
	catch(abort_upload const &ab) {
		d->no_on_error=true;
		return ab.code();
	}
	catch(std::exception const &e) {
		BOOSTER_ERROR("cppcms") << e.what() << booster::trace(e);
		d->no_on_error=true;
		return 500;
	}
	catch(...) {
		BOOSTER_ERROR("cppcms") << "Unknown exception ";
		d->no_on_error=true;
		return 500;
	}
	return 0;
}